

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::optional<tinyusdz::value::StringData>::
initialize<tinyusdz::value::StringData>
          (optional<tinyusdz::value::StringData> *this,StringData *value)

{
  pointer pcVar1;
  
  if (this->has_value_ != true) {
    *(undefined1 **)&this->contained = (undefined1 *)((long)&this->contained + 0x10);
    pcVar1 = (value->value)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->contained,pcVar1,pcVar1 + (value->value)._M_string_length);
    *(int *)((long)&this->contained + 0x28) = value->line_col;
    *(undefined8 *)((long)&this->contained + 0x20) = *(undefined8 *)&value->is_triple_quoted;
    this->has_value_ = true;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5d4,
                "void nonstd::optional_lite::optional<tinyusdz::value::StringData>::initialize(const V &) [T = tinyusdz::value::StringData, V = tinyusdz::value::StringData]"
               );
}

Assistant:

void initialize( V const & value )
    {
        assert( ! has_value()  );
        contained.construct_value( value );
        has_value_ = true;
    }